

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cpp
# Opt level: O1

bool libtorrent::aux::ssl::has_context(stream_handle_type s,context_handle_type c)

{
  SSL_CTX *pSVar1;
  
  pSVar1 = SSL_get_SSL_CTX((SSL *)s);
  return pSVar1 == (SSL_CTX *)c;
}

Assistant:

bool has_context(stream_handle_type s, context_handle_type c)
{
	context_handle_type stream_ctx = get_context(s);
#if defined TORRENT_USE_OPENSSL
	return stream_ctx == c;
#elif defined TORRENT_USE_GNUTLS
	return stream_ctx->native_handle() == c->native_handle();
#endif
}